

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O0

int sat_solver_add_buffer_enable(sat_solver *pSat,int iVarA,int iVarB,int iVarEn,int fCompl)

{
  int iVar1;
  lit local_2c;
  int Cid;
  lit Lits [3];
  int fCompl_local;
  int iVarEn_local;
  int iVarB_local;
  int iVarA_local;
  sat_solver *pSat_local;
  
  Lits[1] = fCompl;
  Lits[2] = iVarEn;
  if (((iVarA < 0) || (iVarB < 0)) || (iVarEn < 0)) {
    __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarEn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x17f,"int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
  }
  local_2c = toLitCond(iVarA,0);
  Cid = toLitCond(iVarB,(uint)((Lits[1] != 0 ^ 0xffU) & 1));
  Lits[0] = toLitCond(Lits[2],1);
  iVar1 = sat_solver_addclause(pSat,&local_2c,Lits + 1);
  if (iVar1 == 0) {
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                  ,0x185,"int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
  }
  local_2c = toLitCond(iVarA,1);
  Cid = toLitCond(iVarB,Lits[1]);
  Lits[0] = toLitCond(Lits[2],1);
  iVar1 = sat_solver_addclause(pSat,&local_2c,Lits + 1);
  if (iVar1 != 0) {
    return 2;
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                ,0x18b,"int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
}

Assistant:

static inline int sat_solver_add_buffer_enable( sat_solver * pSat, int iVarA, int iVarB, int iVarEn, int fCompl )
{
    lit Lits[3];
    int Cid;
    assert( iVarA >= 0 && iVarB >= 0 && iVarEn >= 0 );

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, !fCompl );
    Lits[2] = toLitCond( iVarEn, 1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, fCompl );
    Lits[2] = toLitCond( iVarEn, 1 );
    Cid = sat_solver_addclause( pSat, Lits, Lits + 3 );
    assert( Cid );
    return 2;
}